

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O2

void * raptor::ZeroAlloc(size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = calloc(size,1);
    if (pvVar1 == (void *)0x0) {
      abort();
    }
  }
  return pvVar1;
}

Assistant:

void* ZeroAlloc(size_t size) {
    if (size > 0) {
        void* p = ::calloc(size, 1);
        if (!p) {
            abort();
        }
        return p;
    }
    return nullptr;
}